

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webmdec.cc
# Opt level: O3

void anon_unknown.dwarf_af00::reset(WebmInputContext *webm_ctx)

{
  Segment *this;
  Segment *segment;
  
  if ((long *)webm_ctx->reader != (long *)0x0) {
    (**(code **)(*webm_ctx->reader + 0x18))();
  }
  this = (Segment *)webm_ctx->segment;
  if (this != (Segment *)0x0) {
    mkvparser::Segment::~Segment(this);
    operator_delete(this);
  }
  if (webm_ctx->buffer != (uint8_t *)0x0) {
    operator_delete__(webm_ctx->buffer);
  }
  webm_ctx->block_frame_index = 0;
  webm_ctx->video_track_index = 0;
  webm_ctx->timestamp_ns = 0;
  webm_ctx->block_entry = (void *)0x0;
  webm_ctx->block = (void *)0x0;
  webm_ctx->buffer = (uint8_t *)0x0;
  webm_ctx->cluster = (void *)0x0;
  webm_ctx->reader = (void *)0x0;
  webm_ctx->segment = (void *)0x0;
  webm_ctx->is_key_frame = 0;
  return;
}

Assistant:

void reset(struct WebmInputContext *const webm_ctx) {
  if (webm_ctx->reader != NULL) {
    mkvparser::MkvReader *const reader =
        reinterpret_cast<mkvparser::MkvReader *>(webm_ctx->reader);
    delete reader;
  }
  if (webm_ctx->segment != NULL) {
    mkvparser::Segment *const segment =
        reinterpret_cast<mkvparser::Segment *>(webm_ctx->segment);
    delete segment;
  }
  if (webm_ctx->buffer != NULL) {
    delete[] webm_ctx->buffer;
  }
  webm_ctx->reader = NULL;
  webm_ctx->segment = NULL;
  webm_ctx->buffer = NULL;
  webm_ctx->cluster = NULL;
  webm_ctx->block_entry = NULL;
  webm_ctx->block = NULL;
  webm_ctx->block_frame_index = 0;
  webm_ctx->video_track_index = 0;
  webm_ctx->timestamp_ns = 0;
  webm_ctx->is_key_frame = false;
}